

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O3

Kit_Edge_t
Kit_GraphAddNodeMux(Kit_Graph_t *pGraph,Kit_Edge_t eEdgeC,Kit_Edge_t eEdgeT,Kit_Edge_t eEdgeE,
                   int Type)

{
  int iVar1;
  Kit_Edge_t KVar2;
  Kit_Node_t *pKVar3;
  
  if (Type != 0) {
    pKVar3 = Kit_GraphAppendNode(pGraph);
    pKVar3->eEdge0 = eEdgeC;
    pKVar3->eEdge1 = (Kit_Edge_t)((uint)eEdgeT ^ 1);
    *(uint *)&pKVar3->field_0x10 =
         (((uint)eEdgeT ^ 1) & 1) << 0x10 | ((uint)eEdgeC & 1) << 0xf |
         *(uint *)&pKVar3->field_0x10 & 0xfffe7fff;
    iVar1 = pGraph->nSize;
    pKVar3 = Kit_GraphAppendNode(pGraph);
    pKVar3->eEdge0 = (Kit_Edge_t)((uint)eEdgeC ^ 1);
    pKVar3->eEdge1 = (Kit_Edge_t)((uint)eEdgeE ^ 1);
    *(uint *)&pKVar3->field_0x10 =
         (((uint)eEdgeE ^ 1) & 1) << 0x10 | (((uint)eEdgeC ^ 1) & 1) << 0xf |
         *(uint *)&pKVar3->field_0x10 & 0xfffe7fff;
    KVar2 = Kit_GraphAddNodeOr(pGraph,(Kit_Edge_t)(iVar1 * 2 + 0x7ffffffeU & 0x7ffffffe),
                               (Kit_Edge_t)(pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe));
    return (Kit_Edge_t)((uint)KVar2 ^ 1);
  }
  pKVar3 = Kit_GraphAppendNode(pGraph);
  pKVar3->eEdge0 = eEdgeC;
  pKVar3->eEdge1 = eEdgeT;
  *(uint *)&pKVar3->field_0x10 =
       ((uint)eEdgeT & 1) << 0x10 | ((uint)eEdgeC & 1) << 0xf |
       *(uint *)&pKVar3->field_0x10 & 0xfffe7fff;
  iVar1 = pGraph->nSize;
  pKVar3 = Kit_GraphAppendNode(pGraph);
  pKVar3->eEdge0 = (Kit_Edge_t)((uint)eEdgeC ^ 1);
  pKVar3->eEdge1 = eEdgeE;
  *(uint *)&pKVar3->field_0x10 =
       ((uint)eEdgeE & 1) << 0x10 | (((uint)eEdgeC ^ 1) & 1) << 0xf |
       *(uint *)&pKVar3->field_0x10 & 0xfffe7fff;
  KVar2 = Kit_GraphAddNodeOr(pGraph,(Kit_Edge_t)(iVar1 * 2 + 0x7ffffffeU & 0x7ffffffe),
                             (Kit_Edge_t)(pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe));
  return KVar2;
}

Assistant:

Kit_Edge_t Kit_GraphAddNodeMux( Kit_Graph_t * pGraph, Kit_Edge_t eEdgeC, Kit_Edge_t eEdgeT, Kit_Edge_t eEdgeE, int Type )
{
    Kit_Edge_t eNode0, eNode1, eNode;
    if ( Type == 0 )
    {
        // derive the first AND
        eNode0 = Kit_GraphAddNodeAnd( pGraph, eEdgeC, eEdgeT );
        // derive the second AND
        eEdgeC.fCompl ^= 1;
        eNode1 = Kit_GraphAddNodeAnd( pGraph, eEdgeC, eEdgeE );
        // derive the final OR
        eNode = Kit_GraphAddNodeOr( pGraph, eNode0, eNode1 );
    }
    else
    {
        // complement the arguments
        eEdgeT.fCompl ^= 1;
        eEdgeE.fCompl ^= 1;
        // derive the first AND
        eNode0 = Kit_GraphAddNodeAnd( pGraph, eEdgeC, eEdgeT );
        // derive the second AND
        eEdgeC.fCompl ^= 1;
        eNode1 = Kit_GraphAddNodeAnd( pGraph, eEdgeC, eEdgeE );
        // derive the final OR
        eNode = Kit_GraphAddNodeOr( pGraph, eNode0, eNode1 );
        eNode.fCompl ^= 1;
    }
    return eNode;
}